

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O2

string * toml::detail::format_location_impl
                   (string *__return_storage_ptr__,size_t lnw,string *prev_fname,
                   source_location *loc,string *msg)

{
  size_type sVar1;
  size_t sVar2;
  size_t sVar3;
  __type _Var4;
  ulong uVar5;
  string *psVar6;
  const_reference pvVar7;
  allocator<char> local_1c9;
  string local_1c8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &loc->file_name_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          prev_fname);
  if (!_Var4) {
    format_filename(&oss,loc);
    if ((loc->line_str_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (loc->line_str_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      format_empty_line(&oss,lnw);
    }
  }
  uVar5 = (long)(loc->line_str_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(loc->line_str_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar5 == 2) {
    psVar6 = source_location::first_line_abi_cxx11_(loc);
    sVar1 = psVar6->_M_string_length;
    sVar3 = loc->first_offset_;
    sVar2 = loc->first_line_;
    psVar6 = source_location::first_line_abi_cxx11_(loc);
    format_line(&oss,lnw,sVar2,psVar6);
    sVar2 = loc->first_offset_;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"",&local_1c9);
    format_underline(&oss,lnw,sVar2,(sVar1 - sVar3) + 1,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    sVar3 = loc->last_line_;
    psVar6 = source_location::last_line_abi_cxx11_(loc);
    format_line(&oss,lnw,sVar3,psVar6);
    format_underline(&oss,lnw,1,loc->last_offset_,msg);
  }
  else if (uVar5 == 1) {
    psVar6 = source_location::first_line_abi_cxx11_(loc);
    if (psVar6->_M_string_length < loc->first_offset_) {
      uVar5 = 1;
    }
    else {
      psVar6 = source_location::first_line_abi_cxx11_(loc);
      uVar5 = (psVar6->_M_string_length - loc->first_offset_) + 1;
    }
    sVar3 = loc->first_line_;
    if (loc->length_ < uVar5) {
      uVar5 = loc->length_;
    }
    psVar6 = source_location::first_line_abi_cxx11_(loc);
    format_line(&oss,lnw,sVar3,psVar6);
    format_underline(&oss,lnw,loc->first_offset_,uVar5,msg);
  }
  else if (2 < uVar5) {
    psVar6 = source_location::first_line_abi_cxx11_(loc);
    sVar1 = psVar6->_M_string_length;
    sVar3 = loc->first_offset_;
    sVar2 = loc->first_line_;
    psVar6 = source_location::first_line_abi_cxx11_(loc);
    format_line(&oss,lnw,sVar2,psVar6);
    sVar2 = loc->first_offset_;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"and",&local_1c9);
    format_underline(&oss,lnw,sVar2,(sVar1 - sVar3) + 1,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    sVar3 = loc->first_line_;
    if ((long)(loc->line_str_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(loc->line_str_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x60) {
      pvVar7 = CLI::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&loc->line_str_,1);
      format_line(&oss,lnw,sVar3 + 1,(string *)pvVar7);
      pvVar7 = CLI::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&loc->line_str_,1);
      sVar3 = pvVar7->_M_string_length;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"and",&local_1c9);
      format_underline(&oss,lnw,1,sVar3,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8," ...",&local_1c9);
      format_line(&oss,lnw,sVar3 + 1,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      format_empty_line(&oss,lnw);
    }
    sVar3 = loc->last_line_;
    psVar6 = source_location::last_line_abi_cxx11_(loc);
    format_line(&oss,lnw,sVar3,psVar6);
    format_underline(&oss,lnw,1,loc->last_offset_,msg);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string format_location_impl(const std::size_t lnw,
    const std::string& prev_fname,
    const source_location& loc, const std::string& msg)
{
    std::ostringstream oss;

    if(loc.file_name() != prev_fname)
    {
        format_filename(oss, loc);
        if( ! loc.lines().empty())
        {
            format_empty_line(oss, lnw);
        }
    }

    if(loc.lines().size() == 1)
    {
        // when column points LF, it exceeds the size of the first line.
        std::size_t underline_limit = 1;
        if(loc.first_line().size() < loc.first_column_offset())
        {
            underline_limit = 1;
        }
        else
        {
            underline_limit = loc.first_line().size() - loc.first_column_offset() + 1;
        }
        const auto underline_len = (std::min)(underline_limit, loc.length());

        format_line(oss, lnw, loc.first_line_number(), loc.first_line());
        format_underline(oss, lnw, loc.first_column_offset(), underline_len, msg);
    }
    else if(loc.lines().size() == 2)
    {
        const auto first_underline_len =
            loc.first_line().size() - loc.first_column_offset() + 1;
        format_line(oss, lnw, loc.first_line_number(), loc.first_line());
        format_underline(oss, lnw, loc.first_column_offset(),
                first_underline_len, "");

        format_line(oss, lnw, loc.last_line_number(), loc.last_line());
        format_underline(oss, lnw, 1, loc.last_column_offset(), msg);
    }
    else if(loc.lines().size() > 2)
    {
        const auto first_underline_len =
            loc.first_line().size() - loc.first_column_offset() + 1;
        format_line(oss, lnw, loc.first_line_number(), loc.first_line());
        format_underline(oss, lnw, loc.first_column_offset(),
                first_underline_len, "and");

        if(loc.lines().size() == 3)
        {
            format_line(oss, lnw, loc.first_line_number()+1, loc.lines().at(1));
            format_underline(oss, lnw, 1, loc.lines().at(1).size(), "and");
        }
        else
        {
            format_line(oss, lnw, loc.first_line_number()+1, " ...");
            format_empty_line(oss, lnw);
        }
        format_line(oss, lnw, loc.last_line_number(), loc.last_line());
        format_underline(oss, lnw, 1, loc.last_column_offset(), msg);
    }
    // if loc is empty, do nothing.
    return oss.str();
}